

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGenerator::CreateResponseFile
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *name,
          string *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  cmMakefile *this_00;
  bool bVar1;
  ostream *poVar2;
  bool bVar3;
  byte local_3c1;
  cmAlphaNum local_3c0;
  cmAlphaNum local_390;
  undefined1 local_359;
  undefined1 local_358 [8];
  cmGeneratedFileStream responseStream;
  cmAlphaNum local_c0;
  undefined1 local_90 [8];
  string responseFileNameFull;
  allocator<char> local_59;
  string local_58;
  Encoding local_34;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_30;
  Encoding responseEncoding;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends_local;
  string *options_local;
  string *name_local;
  cmMakefileTargetGenerator *this_local;
  string *responseFileName;
  
  pvStack_30 = makefile_depends;
  makefile_depends_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)options;
  options_local = name;
  name_local = (string *)this;
  this_local = (cmMakefileTargetGenerator *)__return_storage_ptr__;
  local_34 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[5])();
  responseFileNameFull.field_2._M_local_buf[0xb] = '\0';
  bVar3 = local_34 == UTF8_WITH_BOM;
  local_3c1 = 0;
  if (bVar3) {
    this_00 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"MSVC",&local_59);
    responseFileNameFull.field_2._M_local_buf[0xb] = '\x01';
    bVar1 = cmMakefile::IsOn(this_00,&local_58);
    local_3c1 = bVar1 ^ 0xff;
  }
  if ((responseFileNameFull.field_2._M_local_buf[0xb] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if (bVar3) {
    std::allocator<char>::~allocator(&local_59);
  }
  if ((local_3c1 & 1) != 0) {
    local_34 = UTF8;
  }
  cmAlphaNum::cmAlphaNum(&local_c0,&this->TargetBuildDirectoryFull);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&responseStream.field_0x260,'/');
  cmStrCat<std::__cxx11::string>
            ((string *)local_90,&local_c0,(cmAlphaNum *)&responseStream.field_0x260,options_local);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_358,(string *)local_90,false,local_34);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_358,true);
  poVar2 = std::operator<<((ostream *)local_358,(string *)makefile_depends_local);
  std::operator<<(poVar2,"\n");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pvStack_30,(value_type *)local_90);
  local_359 = 0;
  cmAlphaNum::cmAlphaNum(&local_390,&this->TargetBuildDirectory);
  cmAlphaNum::cmAlphaNum(&local_3c0,'/');
  cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_390,&local_3c0,options_local);
  local_359 = 1;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_358);
  std::__cxx11::string::~string((string *)local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::CreateResponseFile(
  const std::string& name, std::string const& options,
  std::vector<std::string>& makefile_depends)
{
  // FIXME: Find a better way to determine the response file encoding,
  // perhaps using tool-specific platform information variables.
  // For now, use the makefile encoding as a heuristic.
  codecvt::Encoding responseEncoding =
    this->GlobalGenerator->GetMakefileEncoding();
  // Non-MSVC tooling may not understand a BOM.
  if (responseEncoding == codecvt::UTF8_WITH_BOM &&
      !this->Makefile->IsOn("MSVC")) {
    responseEncoding = codecvt::UTF8;
  }

  // Create the response file.
  std::string responseFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, '/', name);
  cmGeneratedFileStream responseStream(responseFileNameFull, false,
                                       responseEncoding);
  responseStream.SetCopyIfDifferent(true);
  responseStream << options << "\n";

  // Add a dependency so the target will rebuild when the set of
  // objects changes.
  makefile_depends.push_back(std::move(responseFileNameFull));

  // Construct the name to be used on the command line.
  std::string responseFileName =
    cmStrCat(this->TargetBuildDirectory, '/', name);
  return responseFileName;
}